

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O1

char * google::protobuf::internal::
       FieldParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                 (uint64_t tag,UnknownFieldLiteParserHelper *field_parser,char *ptr,
                 ParseContext *ctx)

{
  char *pcVar1;
  long lVar2;
  uint64_t value;
  uint32_t num;
  ulong uVar3;
  uint64_t uVar4;
  char *pcVar5;
  LogMessage local_20;
  
  num = (uint32_t)(tag >> 3);
  if (num == 0) {
    return (char *)0x0;
  }
  uVar3 = (ulong)((uint)tag & 7);
  switch(uVar3) {
  case 0:
    do {
      uVar3 = uVar3 + 1;
    } while (uVar3 != 10);
    uVar4 = (uint64_t)(byte)*ptr;
    if (*ptr < '\0') {
      pcVar1 = ptr + 2;
      lVar2 = 7;
      do {
        uVar4 = ((ulong)(byte)pcVar1[-1] - 1 << ((byte)lVar2 & 0x3f)) + uVar4;
        value = uVar4;
        pcVar5 = pcVar1;
        if (-1 < pcVar1[-1]) break;
        pcVar1 = pcVar1 + 1;
        lVar2 = lVar2 + 7;
        value = 0;
        pcVar5 = (char *)0x0;
      } while (lVar2 != 0x46);
    }
    else {
      value = uVar4;
      pcVar5 = ptr + 1;
    }
    if (pcVar5 == (char *)0x0) {
      return (char *)0x0;
    }
    UnknownFieldLiteParserHelper::AddVarint(field_parser,num,value);
    return pcVar5;
  case 1:
    UnknownFieldLiteParserHelper::AddFixed64(field_parser,num,*(uint64_t *)ptr);
    return ptr + 8;
  case 2:
    pcVar1 = UnknownFieldLiteParserHelper::ParseLengthDelimited(field_parser,num,ptr,ctx);
    break;
  case 3:
    pcVar1 = UnknownFieldLiteParserHelper::ParseGroup(field_parser,num,ptr,ctx);
    break;
  case 4:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
               ,0x55a);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_20,(char (*) [13])"Can\'t happen");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_20);
  case 5:
    UnknownFieldLiteParserHelper::AddFixed32(field_parser,num,*(uint32_t *)ptr);
    return ptr + 4;
  default:
    goto LAB_00252bc4;
  }
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
LAB_00252bc4:
  return (char *)0x0;
}

Assistant:

[[nodiscard]] const char* FieldParser(uint64_t tag, T& field_parser,
                                      const char* ptr, ParseContext* ctx) {
  uint32_t number = tag >> 3;
  GOOGLE_PROTOBUF_PARSER_ASSERT(number != 0);
  using WireType = internal::WireFormatLite::WireType;
  switch (tag & 7) {
    case WireType::WIRETYPE_VARINT: {
      uint64_t value;
      ptr = VarintParse(ptr, &value);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      field_parser.AddVarint(number, value);
      break;
    }
    case WireType::WIRETYPE_FIXED64: {
      uint64_t value = UnalignedLoad<uint64_t>(ptr);
      ptr += 8;
      field_parser.AddFixed64(number, value);
      break;
    }
    case WireType::WIRETYPE_LENGTH_DELIMITED: {
      ptr = field_parser.ParseLengthDelimited(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_START_GROUP: {
      ptr = field_parser.ParseGroup(number, ptr, ctx);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      break;
    }
    case WireType::WIRETYPE_END_GROUP: {
      ABSL_LOG(FATAL) << "Can't happen";
      break;
    }
    case WireType::WIRETYPE_FIXED32: {
      uint32_t value = UnalignedLoad<uint32_t>(ptr);
      ptr += 4;
      field_parser.AddFixed32(number, value);
      break;
    }
    default:
      return nullptr;
  }
  return ptr;
}